

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O2

void __thiscall WasmCGen::LoadStore(WasmCGen *this,PCSTR stack_type,PCSTR mem_type,bool loadOrStore)

{
  char *pcVar1;
  uint uVar2;
  pointer pcVar3;
  PCSTR pcVar4;
  undefined7 in_register_00000009;
  char *buf;
  long lVar5;
  char *buf_00;
  char acStack_1c8 [104];
  undefined8 uStack_160;
  char local_158 [112];
  char local_e8 [104];
  string local_80;
  PCSTR local_60;
  PCSTR local_58;
  w3SourceGenStack *local_50;
  int local_44;
  char *local_40;
  allocator<char> local_31;
  
  buf = local_158;
  uStack_160 = 0x11799a;
  local_58 = stack_type;
  printf("/*%s*/\n","LoadStore");
  lVar5 = (this->super_w3SourceGen).temp + 1;
  (this->super_w3SourceGen).temp = lVar5;
  uStack_160 = 0x1179b1;
  WasmCGenTemp(local_e8,lVar5);
  lVar5 = (this->super_w3SourceGen).temp + 1;
  (this->super_w3SourceGen).temp = lVar5;
  uStack_160 = 0x1179c8;
  WasmCGenTemp(local_158,lVar5);
  local_44 = (int)CONCAT71(in_register_00000009,loadOrStore);
  local_60 = mem_type;
  if (local_44 == 0) {
    local_40 = (char *)0x0;
  }
  else {
    buf = acStack_1c8;
    lVar5 = (this->super_w3SourceGen).temp + 1;
    (this->super_w3SourceGen).temp = lVar5;
    local_40 = buf;
    WasmCGenTemp(buf,lVar5);
  }
  buf_00 = buf + -0x70;
  lVar5 = (this->super_w3SourceGen).temp + 1;
  (this->super_w3SourceGen).temp = lVar5;
  buf[-0x78] = '\x1a';
  buf[-0x77] = 'z';
  buf[-0x76] = '\x11';
  buf[-0x75] = '\0';
  buf[-0x74] = '\0';
  buf[-0x73] = '\0';
  buf[-0x72] = '\0';
  buf[-0x71] = '\0';
  WasmCGenTemp(buf_00,lVar5);
  pcVar1 = buf + -0xe0;
  lVar5 = (this->super_w3SourceGen).temp + 1;
  (this->super_w3SourceGen).temp = lVar5;
  builtin_strncpy(buf + -0xe8,"5z\x11",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  WasmCGenTemp(pcVar1,lVar5);
  uVar2 = (((this->super_w3SourceGen).super_Wasm.instr)->super_w3DecodedInstructionZeroInit).field_0
          .field_6.offset;
  builtin_strncpy(buf + -0xe8,"Qz\x11",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("const long %s = %u;\n",local_e8,(ulong)uVar2);
  local_50 = &(this->super_w3SourceGen).stack;
  builtin_strncpy(buf + -0xe8,"ez\x11",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  w3SourceGenStack::pop_abi_cxx11_(&local_80,local_50);
  buf[-0xe8] = -0x80;
  buf[-0xe7] = 'z';
  buf[-0xe6] = '\x11';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("const long %s = %s;\n",local_158,local_80._M_dataplus._M_p);
  buf[-0xe8] = -0x78;
  buf[-0xe7] = 'z';
  buf[-0xe6] = '\x11';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  std::__cxx11::string::~string((string *)&local_80);
  buf[-0xe8] = -0x67;
  buf[-0xe7] = 'z';
  buf[-0xe6] = '\x11';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("long %s;\n",buf_00);
  buf[-0xe8] = -0x51;
  buf[-0xe7] = 'z';
  buf[-0xe6] = '\x11';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("%s %s;\n",local_58,local_40);
  buf[-0xe8] = -0x40;
  buf[-0xe7] = 'z';
  buf[-0xe6] = '\x11';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("if (%s >= 0)\n{\n",local_158);
  buf[-0xe8] = -0x22;
  buf[-0xe7] = 'z';
  buf[-0xe6] = '\x11';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  %s = %s + (uint32_t)%s;\n",buf_00,local_e8,local_158);
  buf[-0xe8] = -0xe;
  buf[-0xe7] = 'z';
  buf[-0xe6] = '\x11';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  if (%s < %s) Overflow();",buf_00,local_e8);
  buf[-0xe8] = -2;
  buf[-0xe7] = 'z';
  buf[-0xe6] = '\x11';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  puts("\n}\nelse\n{");
  builtin_strncpy(buf + -0xe8,"\x12{\x11",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  const size_t %s = int_magnitude (%s);\n",pcVar1,local_158);
  builtin_strncpy(buf + -0xe8,"&{\x11",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  if (%s > %s) Overflow();\n",pcVar1,local_e8);
  builtin_strncpy(buf + -0xe8,"={\x11",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  %s = %s - %s;",buf_00,local_e8,pcVar1);
  builtin_strncpy(buf + -0xe8,"I{\x11",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  puts("\n}");
  pcVar4 = local_60;
  builtin_strncpy(buf + -0xe8,"a{\x11",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("if (%s > UINT_MAX - sizeof(%s)) Overflow();\n",buf_00,local_60);
  pcVar1 = local_40;
  pcVar3 = (this->module->name)._M_dataplus._M_p;
  if ((char)local_44 == '\0') {
    buf[-0xe8] = -0x3c;
    buf[-0xe7] = '{';
    buf[-0xe6] = '\x11';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    w3SourceGenStack::pop_abi_cxx11_(&local_80,local_50);
    buf[-0xe8] = -0x22;
    buf[-0xe7] = '{';
    buf[-0xe6] = '\x11';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    printf("*(%s*)(%s + (PCH)%s_mem = %s;\n",pcVar4,buf_00,pcVar3,local_80._M_dataplus._M_p);
  }
  else {
    buf[-0xe8] = -0x70;
    buf[-0xe7] = '{';
    buf[-0xe6] = '\x11';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    printf("%s = *(%s*)(%s + (PCH)%s_mem;\n",local_40,pcVar4,buf_00,pcVar3);
    buf[-0xe8] = -0x5d;
    buf[-0xe7] = '{';
    buf[-0xe6] = '\x11';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_31);
    buf[-0xe8] = -0x52;
    buf[-0xe7] = '{';
    buf[-0xe6] = '\x11';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    w3SourceGen::push(&this->super_w3SourceGen,&local_80);
  }
  buf[-0xe8] = -0x1a;
  buf[-0xe7] = '{';
  buf[-0xe6] = '\x11';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void WasmCGen::LoadStore (PCSTR stack_type, PCSTR mem_type, bool loadOrStore)
{
    printf ("/*%s*/\n", __func__);
    PCSTR offset = TEMP();
    PCSTR i = TEMP();
    PCSTR result = loadOrStore ? TEMP() : 0;
    PCSTR effective_address = TEMP();
    PCSTR u = TEMP();

    printf ("const long %s = %u;\n", offset, instr->offset);
    printf ("const long %s = %s;\n", i, pop().c_str());
    printf ("long %s;\n", effective_address);
    printf ("%s %s;\n", stack_type, result);

    printf ("if (%s >= 0)\n{\n", i);
    printf ("  %s = %s + (uint32_t)%s;\n", effective_address, offset, i);
    printf ("  if (%s < %s) Overflow();", effective_address, offset);
    printf ("\n}\nelse\n{\n");
    printf ("  const size_t %s = int_magnitude (%s);\n", u, i);
    printf ("  if (%s > %s) Overflow();\n", u, offset);
    printf ("  %s = %s - %s;", effective_address, offset, u);
    printf ("\n}\n");

    printf ("if (%s > UINT_MAX - sizeof(%s)) Overflow();\n", effective_address, mem_type);

    PCSTR load[4] = {result, mem_type, effective_address, module->name.c_str()};

    if (loadOrStore)
    {
        printf ("%s = *(%s*)(%s + (PCH)%s_mem;\n", load[0], load[1], load[2], load[3]);
        push(result);
    }
    else
    {
        printf ("*(%s*)(%s + (PCH)%s_mem = %s;\n", load[1], load[2], load[3], pop().c_str());
    }
}